

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilCountAllPairs(Vec_Ptr_t *vSuppFun,int nSimWords,Vec_Int_t *vCounters)

{
  int iVar1;
  uint *pSimInfo;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vSuppFun->nSize; i = i + 1) {
    pSimInfo = (uint *)Vec_PtrEntry(vSuppFun,i);
    iVar1 = Sim_UtilCountOnes(pSimInfo,nSimWords);
    iVar1 = (iVar1 * (iVar1 + -1)) / 2;
    Vec_IntWriteEntry(vCounters,i,iVar1);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Sim_UtilCountAllPairs( Vec_Ptr_t * vSuppFun, int nSimWords, Vec_Int_t * vCounters )
{
    unsigned * pSupp;
    int Counter, nOnes, nPairs, i;
    Counter = 0;
    Vec_PtrForEachEntry( unsigned *, vSuppFun, pSupp, i )
    {
        nOnes  = Sim_UtilCountOnes( pSupp, nSimWords );
        nPairs = nOnes * (nOnes - 1) / 2;
        Vec_IntWriteEntry( vCounters, i, nPairs );
        Counter += nPairs;
    }
    return Counter;
}